

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

shared_ptr<mocker::nasm::Inst> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Inst> *inst,RegMap<std::shared_ptr<Register>_> *mp)

{
  undefined4 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  element_type *peVar9;
  RegMap<std::shared_ptr<Register>_> *mp_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  undefined **ppuVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  bool bVar12;
  shared_ptr<mocker::nasm::Empty> sVar13;
  __shared_ptr<mocker::nasm::Ret,_(__gnu_cxx::_Lock_policy)2> _Var14;
  shared_ptr<mocker::nasm::Mov> sVar15;
  __shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2> _Var16;
  shared_ptr<mocker::nasm::Lea> sVar17;
  shared_ptr<mocker::nasm::UnaryInst> sVar18;
  shared_ptr<mocker::nasm::BinaryInst> sVar19;
  shared_ptr<mocker::nasm::Push> sVar20;
  shared_ptr<mocker::nasm::CJump> sVar21;
  shared_ptr<mocker::nasm::Cqo> sVar22;
  shared_ptr<mocker::nasm::Pop> sVar23;
  shared_ptr<mocker::nasm::Cmp> sVar24;
  shared_ptr<mocker::nasm::Set> sVar25;
  shared_ptr<mocker::nasm::IDiv> sVar26;
  shared_ptr<mocker::nasm::Inst> sVar27;
  shared_ptr<mocker::nasm::Mov> p;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  shared_ptr<mocker::nasm::Addr> local_e8;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  shared_ptr<mocker::nasm::Addr> local_c8;
  shared_ptr<mocker::nasm::Addr> local_b8;
  element_type *local_a0;
  RegMap<std::shared_ptr<Register>_> *local_98;
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_98 = mp;
  sVar13 = dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>
                     ((nasm *)&local_d8,inst);
  _Var14._M_refcount._M_pi =
       sVar13.super___shared_ptr<mocker::nasm::Empty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _M_pi;
  _Var14._M_ptr = local_d8;
  local_a0 = local_d8;
  if ((local_d8 != (element_type *)0x0) ||
     (_Var14 = (__shared_ptr<mocker::nasm::Ret,_(__gnu_cxx::_Lock_policy)2>)
               dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>
                         ((nasm *)&local_40,inst), local_40 != 0)) {
    ppuVar11 = (undefined **)_Var14._M_refcount._M_pi;
    bVar12 = true;
    bVar7 = false;
    bVar6 = false;
    bVar5 = false;
    bVar4 = false;
    bVar3 = false;
    goto LAB_001a704d;
  }
  _Var16 = (__shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>)
           dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_50,inst)
  ;
  if (local_50 == 0) {
    _Var16 = (__shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>)
             dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                       ((nasm *)&local_60,inst);
    if (local_60 != 0) {
      bVar6 = true;
      goto LAB_001a7311;
    }
    _Var16 = (__shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>)
             dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>
                       ((nasm *)&local_70,inst);
    if (local_70 != 0) {
      bVar6 = true;
      bVar5 = true;
      goto LAB_001a7314;
    }
    sVar21 = dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>
                       ((nasm *)&local_80,inst);
    ppuVar11 = (undefined **)
               sVar21.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_80 == 0) {
      sVar22 = dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                         ((nasm *)&local_90,inst);
      ppuVar11 = (undefined **)
                 sVar22.super___shared_ptr<mocker::nasm::Cqo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      bVar12 = local_90 != 0;
      bVar7 = true;
      bVar6 = true;
      bVar5 = true;
      bVar4 = true;
      bVar3 = true;
      goto LAB_001a704d;
    }
    bVar6 = true;
    bVar5 = true;
    bVar4 = true;
  }
  else {
    bVar6 = false;
LAB_001a7311:
    bVar5 = false;
LAB_001a7314:
    bVar4 = false;
    ppuVar11 = (undefined **)_Var16._M_refcount._M_pi;
  }
  bVar7 = true;
  bVar3 = false;
  bVar12 = true;
LAB_001a704d:
  if ((bVar3) && (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    ppuVar11 = (undefined **)extraout_RDX;
  }
  if ((bVar4) && (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    ppuVar11 = (undefined **)extraout_RDX_00;
  }
  if ((bVar5) && (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    ppuVar11 = (undefined **)extraout_RDX_01;
  }
  if ((bVar6) && (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    ppuVar11 = (undefined **)extraout_RDX_02;
  }
  if ((bVar7) && (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    ppuVar11 = (undefined **)extraout_RDX_03;
  }
  mp_00 = local_98;
  if ((local_a0 == (element_type *)0x0) &&
     (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    ppuVar11 = (undefined **)extraout_RDX_04;
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    ppuVar11 = (undefined **)extraout_RDX_05;
  }
  if (bVar12) {
    *(element_type **)this =
         (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  else {
    sVar15 = dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
                       ((nasm *)&local_d8,inst);
    peVar9 = local_d8;
    ppuVar11 = (undefined **)
               sVar15.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    if (local_d8 != (element_type *)0x0) {
      local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8[1].super_Inst._vptr_Inst;
      local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8[2].super_Inst._vptr_Inst;
      if (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      replaceRegs((nasm *)&local_f8,&local_e8,mp_00);
      local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8[3].super_Inst._vptr_Inst;
      local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8[4].super_Inst._vptr_Inst;
      if (local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      replaceRegs((nasm *)&local_c8,&local_b8,mp_00);
      puVar10 = (undefined8 *)operator_new(0x38);
      puVar10[1] = 0x100000001;
      *puVar10 = &PTR___Sp_counted_ptr_inplace_001efed0;
      puVar10[2] = &PTR__Mov_001eff20;
      puVar10[3] = local_f8;
      puVar10[4] = p_Stack_f0;
      puVar10[5] = local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
      puVar10[6] = local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      *(undefined8 **)this = puVar10 + 2;
      *(undefined8 **)(this + 8) = puVar10;
      local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f8 = 0;
      ppuVar11 = &PTR__Mov_001eff20;
      if (local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        ppuVar11 = (undefined **)extraout_RDX_06;
      }
      if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
        ppuVar11 = (undefined **)extraout_RDX_07;
      }
      if (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        ppuVar11 = (undefined **)extraout_RDX_08;
      }
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      ppuVar11 = (undefined **)extraout_RDX_09;
    }
    if (peVar9 == (element_type *)0x0) {
      sVar17 = dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                         ((nasm *)&local_d8,inst);
      peVar9 = local_d8;
      ppuVar11 = (undefined **)
                 sVar17.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (local_d8 != (element_type *)0x0) {
        local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_d8[1].super_Inst._vptr_Inst;
        local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8[2].super_Inst._vptr_Inst;
        if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        replaceRegs((nasm *)&local_e8,&local_c8,mp_00);
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>((nasm *)&local_f8,&local_e8)
        ;
        replaceRegs((nasm *)&local_b8,(shared_ptr<mocker::nasm::Addr> *)(local_d8 + 3),mp_00);
        puVar10 = (undefined8 *)operator_new(0x38);
        puVar10[1] = 0x100000001;
        *puVar10 = &PTR___Sp_counted_ptr_inplace_001f01a8;
        puVar10[2] = &PTR__Lea_001f01f8;
        puVar10[3] = local_f8;
        puVar10[4] = p_Stack_f0;
        puVar10[5] = local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
        puVar10[6] = local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        *(undefined8 **)this = puVar10 + 2;
        *(undefined8 **)(this + 8) = puVar10;
        local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_b8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_f8 = 0;
        ppuVar11 = &PTR__Lea_001f01f8;
        if (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          ppuVar11 = (undefined **)extraout_RDX_10;
        }
        if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          ppuVar11 = (undefined **)extraout_RDX_11;
        }
      }
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
        ppuVar11 = (undefined **)extraout_RDX_12;
      }
      if (peVar9 == (element_type *)0x0) {
        sVar18 = dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                           ((nasm *)&local_d8,inst);
        peVar9 = local_d8;
        ppuVar11 = (undefined **)
                   sVar18.super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
        if (local_d8 != (element_type *)0x0) {
          uVar1 = *(undefined4 *)&local_d8[1].super_Inst._vptr_Inst;
          local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_d8[2].super_Inst._vptr_Inst;
          local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8[3].super_Inst._vptr_Inst;
          if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          replaceRegs((nasm *)&local_e8,&local_c8,mp_00);
          dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                    ((nasm *)&local_f8,&local_e8);
          puVar10 = (undefined8 *)operator_new(0x30);
          puVar10[1] = 0x100000001;
          *puVar10 = &PTR___Sp_counted_ptr_inplace_001f08d0;
          puVar10[2] = &PTR__UnaryInst_001f0920;
          *(undefined4 *)(puVar10 + 3) = uVar1;
          puVar10[4] = local_f8;
          puVar10[5] = p_Stack_f0;
          *(undefined8 **)this = puVar10 + 2;
          *(undefined8 **)(this + 8) = puVar10;
          p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_f8 = 0;
          ppuVar11 = &PTR__UnaryInst_001f0920;
          if (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            ppuVar11 = (undefined **)extraout_RDX_13;
          }
          if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            ppuVar11 = (undefined **)extraout_RDX_14;
          }
        }
        if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
          ppuVar11 = (undefined **)extraout_RDX_15;
        }
        if (peVar9 == (element_type *)0x0) {
          sVar19 = dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                             ((nasm *)&local_d8,inst);
          peVar9 = local_d8;
          ppuVar11 = (undefined **)
                     sVar19.super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
          if (local_d8 != (element_type *)0x0) {
            uVar1 = *(undefined4 *)&local_d8[1].super_Inst._vptr_Inst;
            replaceRegs((nasm *)&local_f8,(shared_ptr<mocker::nasm::Addr> *)(local_d8 + 2),mp_00);
            replaceRegs((nasm *)&local_e8,(shared_ptr<mocker::nasm::Addr> *)(local_d8 + 4),mp_00);
            puVar10 = (undefined8 *)operator_new(0x40);
            puVar10[1] = 0x100000001;
            *puVar10 = &PTR___Sp_counted_ptr_inplace_001f0450;
            puVar10[2] = &PTR__BinaryInst_001f04a0;
            *(undefined4 *)(puVar10 + 3) = uVar1;
            puVar10[4] = local_f8;
            puVar10[5] = p_Stack_f0;
            puVar10[6] = local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
            puVar10[7] = local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            *(undefined8 **)this = puVar10 + 2;
            *(undefined8 **)(this + 8) = puVar10;
            local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_f8 = 0;
            ppuVar11 = &PTR__BinaryInst_001f04a0;
          }
          if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
            ppuVar11 = (undefined **)extraout_RDX_16;
          }
          if (peVar9 == (element_type *)0x0) {
            sVar20 = dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                               ((nasm *)&local_d8,inst);
            peVar9 = local_d8;
            ppuVar11 = (undefined **)
                       sVar20.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
            if (local_d8 != (element_type *)0x0) {
              local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_d8[1].super_Inst._vptr_Inst;
              local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8[2].super_Inst._vptr_Inst
              ;
              if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              replaceRegs((nasm *)&local_e8,&local_c8,mp_00);
              dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                        ((nasm *)&local_f8,&local_e8);
              puVar10 = (undefined8 *)operator_new(0x28);
              puVar10[1] = 0x100000001;
              *puVar10 = &PTR___Sp_counted_ptr_inplace_001efe38;
              puVar10[2] = &PTR__Push_001efe88;
              puVar10[3] = local_f8;
              puVar10[4] = p_Stack_f0;
              *(undefined8 **)this = puVar10 + 2;
              *(undefined8 **)(this + 8) = puVar10;
              p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_f8 = 0;
              ppuVar11 = &PTR__Push_001efe88;
              if (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_e8.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                ppuVar11 = (undefined **)extraout_RDX_17;
              }
              if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_c8.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                ppuVar11 = (undefined **)extraout_RDX_18;
              }
            }
            if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
              ppuVar11 = (undefined **)extraout_RDX_19;
            }
            if (peVar9 == (element_type *)0x0) {
              sVar23 = dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>
                                 ((nasm *)&local_d8,inst);
              peVar9 = local_d8;
              ppuVar11 = (undefined **)
                         sVar23.super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
              if (local_d8 != (element_type *)0x0) {
                local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)local_d8[1].super_Inst._vptr_Inst;
                local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_d8[2].super_Inst._vptr_Inst;
                if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_c8.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_c8.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                replaceRegs((nasm *)&local_e8,&local_c8,mp_00);
                dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                          ((nasm *)&local_f8,&local_e8);
                puVar10 = (undefined8 *)operator_new(0x28);
                puVar10[1] = 0x100000001;
                *puVar10 = &PTR___Sp_counted_ptr_inplace_001f0ba0;
                puVar10[2] = &PTR__Pop_001f0bf0;
                puVar10[3] = local_f8;
                puVar10[4] = p_Stack_f0;
                *(undefined8 **)this = puVar10 + 2;
                *(undefined8 **)(this + 8) = puVar10;
                p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_f8 = 0;
                ppuVar11 = &PTR__Pop_001f0bf0;
                if (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_e8.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                  ppuVar11 = (undefined **)extraout_RDX_20;
                }
                if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_c8.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                  ppuVar11 = (undefined **)extraout_RDX_21;
                }
              }
              if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
                ppuVar11 = (undefined **)extraout_RDX_22;
              }
              if (peVar9 == (element_type *)0x0) {
                sVar24 = dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                                   ((nasm *)&local_d8,inst);
                peVar9 = local_d8;
                ppuVar11 = (undefined **)
                           sVar24.super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                if (local_d8 != (element_type *)0x0) {
                  replaceRegs((nasm *)&local_f8,(shared_ptr<mocker::nasm::Addr> *)(local_d8 + 1),
                              mp_00);
                  replaceRegs((nasm *)&local_e8,(shared_ptr<mocker::nasm::Addr> *)(local_d8 + 3),
                              mp_00);
                  puVar10 = (undefined8 *)operator_new(0x38);
                  puVar10[1] = 0x100000001;
                  *puVar10 = &PTR___Sp_counted_ptr_inplace_001f04d8;
                  puVar10[2] = &PTR__Cmp_001f0528;
                  puVar10[3] = local_f8;
                  puVar10[4] = p_Stack_f0;
                  puVar10[5] = local_e8.
                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
                  puVar10[6] = local_e8.
                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                  *(undefined8 **)this = puVar10 + 2;
                  *(undefined8 **)(this + 8) = puVar10;
                  local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)0x0;
                  p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_f8 = 0;
                  ppuVar11 = &PTR__Cmp_001f0528;
                }
                if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
                  ppuVar11 = (undefined **)extraout_RDX_23;
                }
                if (peVar9 == (element_type *)0x0) {
                  sVar25 = dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                                     ((nasm *)&local_d8,inst);
                  peVar9 = local_d8;
                  ppuVar11 = (undefined **)
                             sVar25.
                             super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                  if (local_d8 != (element_type *)0x0) {
                    uVar1 = *(undefined4 *)&local_d8[1].super_Inst._vptr_Inst;
                    local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)local_d8[2].super_Inst._vptr_Inst;
                    local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_d8[3].super_Inst._vptr_Inst;
                    if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_c8.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_c8.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    replaceRegs((nasm *)&local_e8,&local_c8,mp_00);
                    dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                              ((nasm *)&local_f8,&local_e8);
                    puVar10 = (undefined8 *)operator_new(0x30);
                    puVar10[1] = 0x100000001;
                    *puVar10 = &PTR___Sp_counted_ptr_inplace_001f05e8;
                    puVar10[2] = &PTR__Set_001f0638;
                    *(undefined4 *)(puVar10 + 3) = uVar1;
                    puVar10[4] = local_f8;
                    puVar10[5] = p_Stack_f0;
                    *(undefined8 **)this = puVar10 + 2;
                    *(undefined8 **)(this + 8) = puVar10;
                    p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_f8 = 0;
                    ppuVar11 = &PTR__Set_001f0638;
                    if (local_e8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_e8.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      ppuVar11 = (undefined **)extraout_RDX_24;
                    }
                    if (local_c8.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_c8.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      ppuVar11 = (undefined **)extraout_RDX_25;
                    }
                  }
                  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
                    ppuVar11 = (undefined **)extraout_RDX_26;
                  }
                  if (peVar9 == (element_type *)0x0) {
                    sVar26 = dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                                       ((nasm *)&local_d8,inst);
                    ppuVar11 = (undefined **)
                               sVar26.
                               super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                    if (local_d8 != (element_type *)0x0) {
                      replaceRegs((nasm *)&local_f8,(shared_ptr<mocker::nasm::Addr> *)(local_d8 + 1)
                                  ,mp_00);
                      puVar10 = (undefined8 *)operator_new(0x28);
                      p_Var2 = p_Stack_f0;
                      uVar8 = local_f8;
                      puVar10[1] = 0x100000001;
                      *puVar10 = &PTR___Sp_counted_ptr_inplace_001f03c8;
                      local_f8 = 0;
                      p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      ppuVar11 = &PTR__IDiv_001f0418;
                      puVar10[2] = &PTR__IDiv_001f0418;
                      puVar10[3] = uVar8;
                      puVar10[4] = p_Var2;
                      *(undefined8 **)this = puVar10 + 2;
                      *(undefined8 **)(this + 8) = puVar10;
                    }
                    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
                      ppuVar11 = (undefined **)extraout_RDX_27;
                    }
                    if (local_d8 == (element_type *)0x0) {
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                    ,0xdd,
                                    "std::shared_ptr<Inst> mocker::nasm::replaceRegs(const std::shared_ptr<Inst> &, const RegMap<std::shared_ptr<Register>> &)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  sVar27.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar11;
  sVar27.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Inst>)
         sVar27.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Inst> replaceRegs(const std::shared_ptr<Inst> &inst,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  if (dyc<Empty>(inst) || dyc<Ret>(inst) || dyc<Call>(inst) ||
      dyc<Leave>(inst) || dyc<Jmp>(inst) || dyc<CJump>(inst) || dyc<Cqo>(inst))
    return inst;
  if (auto p = dyc<Mov>(inst)) {
    return std::make_shared<Mov>(replaceRegs(p->getDest(), mp),
                                 replaceRegs(p->getOperand(), mp));
  }
  if (auto p = dyc<Lea>(inst)) {
    return std::make_shared<Lea>(dyc<Register>(replaceRegs(p->getDest(), mp)),
                                 replaceRegs(p->getAddr(), mp));
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return std::make_shared<UnaryInst>(
        p->getOp(), dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return std::make_shared<BinaryInst>(p->getType(),
                                        replaceRegs(p->getLhs(), mp),
                                        replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Push>(inst)) {
    return std::make_shared<Push>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Pop>(inst)) {
    return std::make_shared<Pop>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Cmp>(inst)) {
    return std::make_shared<Cmp>(replaceRegs(p->getLhs(), mp),
                                 replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Set>(inst)) {
    return std::make_shared<Set>(p->getOp(),
                                 dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return std::make_shared<IDiv>(replaceRegs(p->getRhs(), mp));
  }
  assert(false);
}